

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-param-util.h
# Opt level: O2

void __thiscall
testing::internal::
CartesianProductGenerator<double_(*)(const_unsigned_char_*,_int,_int,_int,_int),_double_(*)(const_unsigned_char_*,_int,_int,_int,_int),_int,_int>
::IteratorImpl<testing::internal::IndexSequence<0UL,_1UL,_2UL,_3UL>_>::ComputeCurrentValue
          (IteratorImpl<testing::internal::IndexSequence<0UL,_1UL,_2UL,_3UL>_> *this)

{
  bool bVar1;
  _func_double_uchar_ptr_int_int_int_int **__args_1;
  int *__args_2;
  int *__args_3;
  __shared_ptr<std::tuple<double_(*)(const_unsigned_char_*,_int,_int,_int,_int),_double_(*)(const_unsigned_char_*,_int,_int,_int,_int),_int,_int>,_(__gnu_cxx::_Lock_policy)2>
  _Stack_38;
  
  bVar1 = AtEnd(this);
  if (!bVar1) {
    __args_1 = (_func_double_uchar_ptr_int_int_int_int **)
               (**(code **)(*(long *)(this->current_).
                                     super__Tuple_impl<0UL,_testing::internal::ParamIterator<double_(*)(const_unsigned_char_*,_int,_int,_int,_int)>,_testing::internal::ParamIterator<double_(*)(const_unsigned_char_*,_int,_int,_int,_int)>,_testing::internal::ParamIterator<int>,_testing::internal::ParamIterator<int>_>
                                     .
                                     super__Head_base<0UL,_testing::internal::ParamIterator<double_(*)(const_unsigned_char_*,_int,_int,_int,_int)>,_false>
                                     ._M_head_impl.impl_._M_t.
                                     super___uniq_ptr_impl<testing::internal::ParamIteratorInterface<double_(*)(const_unsigned_char_*,_int,_int,_int,_int)>,_std::default_delete<testing::internal::ParamIteratorInterface<double_(*)(const_unsigned_char_*,_int,_int,_int,_int)>_>_>
                                     ._M_t.
                                     super__Tuple_impl<0UL,_testing::internal::ParamIteratorInterface<double_(*)(const_unsigned_char_*,_int,_int,_int,_int)>_*,_std::default_delete<testing::internal::ParamIteratorInterface<double_(*)(const_unsigned_char_*,_int,_int,_int,_int)>_>_>
                                     .
                                     super__Head_base<0UL,_testing::internal::ParamIteratorInterface<double_(*)(const_unsigned_char_*,_int,_int,_int,_int)>_*,_false>
                           + 0x28))();
    __args_2 = (int *)(**(code **)(*(long *)(this->current_).
                                            super__Tuple_impl<0UL,_testing::internal::ParamIterator<double_(*)(const_unsigned_char_*,_int,_int,_int,_int)>,_testing::internal::ParamIterator<double_(*)(const_unsigned_char_*,_int,_int,_int,_int)>,_testing::internal::ParamIterator<int>,_testing::internal::ParamIterator<int>_>
                                            .
                                            super__Tuple_impl<1UL,_testing::internal::ParamIterator<double_(*)(const_unsigned_char_*,_int,_int,_int,_int)>,_testing::internal::ParamIterator<int>,_testing::internal::ParamIterator<int>_>
                                            .
                                            super__Head_base<1UL,_testing::internal::ParamIterator<double_(*)(const_unsigned_char_*,_int,_int,_int,_int)>,_false>
                                            ._M_head_impl.impl_._M_t.
                                            super___uniq_ptr_impl<testing::internal::ParamIteratorInterface<double_(*)(const_unsigned_char_*,_int,_int,_int,_int)>,_std::default_delete<testing::internal::ParamIteratorInterface<double_(*)(const_unsigned_char_*,_int,_int,_int,_int)>_>_>
                                            ._M_t.
                                            super__Tuple_impl<0UL,_testing::internal::ParamIteratorInterface<double_(*)(const_unsigned_char_*,_int,_int,_int,_int)>_*,_std::default_delete<testing::internal::ParamIteratorInterface<double_(*)(const_unsigned_char_*,_int,_int,_int,_int)>_>_>
                                            .
                                            super__Head_base<0UL,_testing::internal::ParamIteratorInterface<double_(*)(const_unsigned_char_*,_int,_int,_int,_int)>_*,_false>
                                  + 0x28))();
    __args_3 = (int *)(**(code **)(*(long *)(this->current_).
                                            super__Tuple_impl<0UL,_testing::internal::ParamIterator<double_(*)(const_unsigned_char_*,_int,_int,_int,_int)>,_testing::internal::ParamIterator<double_(*)(const_unsigned_char_*,_int,_int,_int,_int)>,_testing::internal::ParamIterator<int>,_testing::internal::ParamIterator<int>_>
                                            .
                                            super__Tuple_impl<1UL,_testing::internal::ParamIterator<double_(*)(const_unsigned_char_*,_int,_int,_int,_int)>,_testing::internal::ParamIterator<int>,_testing::internal::ParamIterator<int>_>
                                            .
                                            super__Tuple_impl<2UL,_testing::internal::ParamIterator<int>,_testing::internal::ParamIterator<int>_>
                                            .
                                            super__Head_base<2UL,_testing::internal::ParamIterator<int>,_false>
                                            ._M_head_impl.impl_._M_t.
                                            super___uniq_ptr_impl<testing::internal::ParamIteratorInterface<int>,_std::default_delete<testing::internal::ParamIteratorInterface<int>_>_>
                                            ._M_t.
                                            super__Tuple_impl<0UL,_testing::internal::ParamIteratorInterface<int>_*,_std::default_delete<testing::internal::ParamIteratorInterface<int>_>_>
                                            .
                                            super__Head_base<0UL,_testing::internal::ParamIteratorInterface<int>_*,_false>
                                  + 0x28))();
    (**(code **)(*(long *)(this->current_).
                          super__Tuple_impl<0UL,_testing::internal::ParamIterator<double_(*)(const_unsigned_char_*,_int,_int,_int,_int)>,_testing::internal::ParamIterator<double_(*)(const_unsigned_char_*,_int,_int,_int,_int)>,_testing::internal::ParamIterator<int>,_testing::internal::ParamIterator<int>_>
                          .
                          super__Tuple_impl<1UL,_testing::internal::ParamIterator<double_(*)(const_unsigned_char_*,_int,_int,_int,_int)>,_testing::internal::ParamIterator<int>,_testing::internal::ParamIterator<int>_>
                          .
                          super__Tuple_impl<2UL,_testing::internal::ParamIterator<int>,_testing::internal::ParamIterator<int>_>
                          .super__Tuple_impl<3UL,_testing::internal::ParamIterator<int>_>.
                          super__Head_base<3UL,_testing::internal::ParamIterator<int>,_false>.
                          _M_head_impl.impl_ + 0x28))();
    std::
    make_shared<std::tuple<double(*)(unsigned_char_const*,int,int,int,int),double(*)(unsigned_char_const*,int,int,int,int),int,int>,double(*const&)(unsigned_char_const*,int,int,int,int),double(*const&)(unsigned_char_const*,int,int,int,int),int_const&,int_const&>
              ((_func_double_uchar_ptr_int_int_int_int **)&_Stack_38,__args_1,__args_2,__args_3);
    std::
    __shared_ptr<std::tuple<double_(*)(const_unsigned_char_*,_int,_int,_int,_int),_double_(*)(const_unsigned_char_*,_int,_int,_int,_int),_int,_int>,_(__gnu_cxx::_Lock_policy)2>
    ::operator=(&(this->current_value_).
                 super___shared_ptr<std::tuple<double_(*)(const_unsigned_char_*,_int,_int,_int,_int),_double_(*)(const_unsigned_char_*,_int,_int,_int,_int),_int,_int>,_(__gnu_cxx::_Lock_policy)2>
                ,&_Stack_38);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_38._M_refcount);
  }
  return;
}

Assistant:

void ComputeCurrentValue() {
      if (!AtEnd())
        current_value_ = std::make_shared<ParamType>(*std::get<I>(current_)...);
    }